

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void walRestartHdr(Wal *pWal,u32 salt1)

{
  u32 *puVar1;
  u32 uVar2;
  int iVar3;
  long lVar4;
  
  puVar1 = *pWal->apWiData;
  pWal->nCkpt = pWal->nCkpt + 1;
  (pWal->hdr).mxFrame = 0;
  uVar2 = sqlite3Get4byte((u8 *)(pWal->hdr).aSalt);
  iVar3 = uVar2 + 1;
  *(char *)(pWal->hdr).aSalt = (char)((uint)iVar3 >> 0x18);
  *(char *)((long)(pWal->hdr).aSalt + 1) = (char)((uint)iVar3 >> 0x10);
  *(char *)((long)(pWal->hdr).aSalt + 2) = (char)((uint)iVar3 >> 8);
  *(char *)((long)(pWal->hdr).aSalt + 3) = (char)iVar3;
  (pWal->hdr).aSalt[1] = salt1;
  walIndexWriteHdr(pWal);
  puVar1[0x18] = 0;
  puVar1[0x20] = 0;
  puVar1[0x1a] = 0;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    puVar1[lVar4 + 0x1b] = 0xffffffff;
  }
  return;
}

Assistant:

static void walRestartHdr(Wal *pWal, u32 salt1){
  volatile WalCkptInfo *pInfo = walCkptInfo(pWal);
  int i;                          /* Loop counter */
  u32 *aSalt = pWal->hdr.aSalt;   /* Big-endian salt values */
  pWal->nCkpt++;
  pWal->hdr.mxFrame = 0;
  sqlite3Put4byte((u8*)&aSalt[0], 1 + sqlite3Get4byte((u8*)&aSalt[0]));
  memcpy(&pWal->hdr.aSalt[1], &salt1, 4);
  walIndexWriteHdr(pWal);
  pInfo->nBackfill = 0;
  pInfo->nBackfillAttempted = 0;
  pInfo->aReadMark[1] = 0;
  for(i=2; i<WAL_NREADER; i++) pInfo->aReadMark[i] = READMARK_NOT_USED;
  assert( pInfo->aReadMark[0]==0 );
}